

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidLayerNormalizationWrongGammaOrBeta(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *this;
  LayerNormalizationLayerParams *this_00;
  WeightParams *pWVar7;
  ostream *poVar8;
  string *psVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  Model m;
  Result res4;
  Result res3;
  Result res2;
  Result res1;
  
  CoreML::Specification::Model::Model(&m);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"output");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  pNVar6 = CoreML::Specification::Model::mutable_neuralnetwork(&m);
  pNVar6->arrayinputshapemapping_ = 1;
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar6->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"output");
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_layernormalization(this);
  CoreML::Specification::LayerNormalizationLayerParams::add_normalizedshape(this_00,1);
  pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_00);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar7,1.0);
  pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta(this_00);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar7,1.0);
  pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_00);
  CoreML::Specification::WeightParams::mutable_quantization(pWVar7);
  CoreML::validate<(MLModelType)500>(&res1,&m);
  bVar1 = CoreML::Result::good(&res1);
  if (bVar1) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x170c);
    poVar8 = std::operator<<(poVar8,": error: ");
    pcVar12 = "!((res1).good())";
  }
  else {
    psVar9 = CoreML::Result::message_abi_cxx11_(&res1);
    lVar10 = std::__cxx11::string::find((char *)psVar9,0x265d77);
    if (lVar10 != -1) {
      pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_00);
      (pWVar7->floatvalue_).current_size_ = 0;
      pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_00);
      CoreML::Specification::WeightParams::add_floatvalue(pWVar7,1.0);
      pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta(this_00);
      CoreML::Specification::WeightParams::add_floatvalue(pWVar7,1.0);
      pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta(this_00);
      CoreML::Specification::WeightParams::mutable_quantization(pWVar7);
      CoreML::validate<(MLModelType)500>(&res2,&m);
      bVar1 = CoreML::Result::good(&res2);
      if (bVar1) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar8 = std::operator<<(poVar8,":");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1715);
        poVar8 = std::operator<<(poVar8,": error: ");
        pcVar12 = "!((res2).good())";
LAB_00154071:
        poVar8 = std::operator<<(poVar8,pcVar12);
        poVar8 = std::operator<<(poVar8," was false, expected true.");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar11 = 1;
      }
      else {
        psVar9 = CoreML::Result::message_abi_cxx11_(&res2);
        lVar10 = std::__cxx11::string::find((char *)psVar9,0x265d77);
        if (lVar10 == -1) {
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar8 = std::operator<<(poVar8,":");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1716);
          poVar8 = std::operator<<(poVar8,": error: ");
          pcVar12 = "res2.message().find(\"quantized\") != std::string::npos";
          goto LAB_00154071;
        }
        pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_00);
        CoreML::Specification::WeightParams::clear_quantization(pWVar7);
        pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta(this_00);
        CoreML::Specification::WeightParams::clear_quantization(pWVar7);
        pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_00);
        CoreML::Specification::WeightParams::add_floatvalue(pWVar7,1.0);
        CoreML::validate<(MLModelType)500>(&res3,&m);
        bVar1 = CoreML::Result::good(&res3);
        if (bVar1) {
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar8 = std::operator<<(poVar8,":");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x171f);
          poVar8 = std::operator<<(poVar8,": error: ");
          pcVar12 = "!((res3).good())";
LAB_001541bf:
          poVar8 = std::operator<<(poVar8,pcVar12);
          poVar8 = std::operator<<(poVar8," was false, expected true.");
          std::endl<char,std::char_traits<char>>(poVar8);
          iVar11 = 1;
        }
        else {
          psVar9 = CoreML::Result::message_abi_cxx11_(&res3);
          lVar10 = std::__cxx11::string::find((char *)psVar9,0x265ded);
          if (lVar10 == -1) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar8 = std::operator<<(poVar8,":");
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1720);
            poVar8 = std::operator<<(poVar8,": error: ");
            pcVar12 = "res3.message().find(\"Shape of gamma\") != std::string::npos";
            goto LAB_001541bf;
          }
          pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_00);
          (pWVar7->floatvalue_).current_size_ = 0;
          pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma(this_00);
          CoreML::Specification::WeightParams::add_floatvalue(pWVar7,1.0);
          pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta(this_00);
          CoreML::Specification::WeightParams::add_floatvalue(pWVar7,1.0);
          pWVar7 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta(this_00);
          CoreML::Specification::WeightParams::add_floatvalue(pWVar7,1.0);
          CoreML::validate<(MLModelType)500>(&res4,&m);
          bVar1 = CoreML::Result::good(&res4);
          if (bVar1) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar8 = std::operator<<(poVar8,":");
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1728);
            poVar8 = std::operator<<(poVar8,": error: ");
            pcVar12 = "!((res4).good())";
LAB_0015424e:
            poVar8 = std::operator<<(poVar8,pcVar12);
            poVar8 = std::operator<<(poVar8," was false, expected true.");
            std::endl<char,std::char_traits<char>>(poVar8);
            iVar11 = 1;
          }
          else {
            psVar9 = CoreML::Result::message_abi_cxx11_(&res4);
            iVar11 = 0;
            lVar10 = std::__cxx11::string::find((char *)psVar9,0x265e37);
            if (lVar10 == -1) {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar8 = std::operator<<(poVar8,":");
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1729);
              poVar8 = std::operator<<(poVar8,": error: ");
              pcVar12 = "res4.message().find(\"Shape of beta\") != std::string::npos";
              goto LAB_0015424e;
            }
          }
          std::__cxx11::string::~string((string *)&res4.m_message);
        }
        std::__cxx11::string::~string((string *)&res3.m_message);
      }
      std::__cxx11::string::~string((string *)&res2.m_message);
      goto LAB_00154291;
    }
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x170d);
    poVar8 = std::operator<<(poVar8,": error: ");
    pcVar12 = "res1.message().find(\"quantized\") != std::string::npos";
  }
  poVar8 = std::operator<<(poVar8,pcVar12);
  poVar8 = std::operator<<(poVar8," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar8);
  iVar11 = 1;
LAB_00154291:
  std::__cxx11::string::~string((string *)&res1.m_message);
  CoreML::Specification::Model::~Model(&m);
  return iVar11;
}

Assistant:

int testInvalidLayerNormalizationWrongGammaOrBeta() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    auto* params = layers->mutable_layernormalization();
    params->add_normalizedshape(1);

    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);
    params->mutable_gamma()->mutable_quantization();

    // value of gamma and beta should be unquantized
    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("quantized") != std::string::npos);

    params->mutable_gamma()->clear_floatvalue();
    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);
    params->mutable_beta()->mutable_quantization();

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("quantized") != std::string::npos);

    // shape of gamma and beta should be match normalized shape

    params->mutable_gamma()->clear_quantization();
    params->mutable_beta()->clear_quantization();
    params->mutable_gamma()->add_floatvalue(1.0);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("Shape of gamma") != std::string::npos);

    params->mutable_gamma()->clear_floatvalue();
    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);

    Result res4 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res4);
    ML_ASSERT(res4.message().find("Shape of beta") != std::string::npos);

    return 0;
}